

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int parsefmt(char *format,outsegment *out,va_input *in,int *opieces,int *ipieces,
            __va_list_tag *arglist)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  va_input *input;
  char *pcVar4;
  va_input *pvVar5;
  int *piVar6;
  bool bVar7;
  undefined8 *local_1d0;
  int *local_1b0;
  uint *local_198;
  undefined8 *local_180;
  undefined8 *local_168;
  undefined8 *local_150;
  undefined8 *local_138;
  undefined8 *local_120;
  undefined8 *local_108;
  va_input *iptr_1;
  _Bool is_neg;
  _Bool loopit;
  va_input *iptr;
  char *start;
  int use_dollar;
  outsegment *optr;
  size_t outlen;
  uchar usedinput [16];
  int local_6c;
  int local_68;
  int ocount;
  int i;
  int max_param;
  FormatType type;
  uint flags;
  int precision;
  int width;
  int param;
  int param_num;
  char *fmt;
  __va_list_tag *arglist_local;
  int *ipieces_local;
  int *opieces_local;
  va_input *in_local;
  outsegment *out_local;
  char *format_local;
  
  width = 0;
  ocount = -1;
  local_6c = 0;
  start._4_4_ = 0;
  _param = (va_input *)format;
  fmt = (char *)arglist;
  arglist_local = (__va_list_tag *)ipieces;
  ipieces_local = opieces;
  opieces_local = (int *)in;
  in_local = (va_input *)out;
  out_local = (outsegment *)format;
  memset(&outlen,0,0x10);
  iptr = (va_input *)format;
LAB_001149e0:
  do {
    while( true ) {
      while( true ) {
        pvVar5 = _param;
        if ((char)_param->type == FORMAT_STRING) {
          if ((char *)((long)_param - (long)iptr) != (char *)0x0) {
            if (0x80 < local_6c + 1) {
              return 0xb;
            }
            *(undefined4 *)((long)&in_local[(long)local_6c * 2].val + 4) = 0;
            *(undefined4 *)&in_local[(long)local_6c * 2].val = 0x100000;
            *(va_input **)(in_local + (long)local_6c * 2 + 1) = iptr;
            in_local[(long)local_6c * 2 + 1].val.str = (char *)((long)_param - (long)iptr);
            local_6c = local_6c + 1;
          }
          local_68 = 0;
          while( true ) {
            if (ocount + 1 <= local_68) {
              arglist_local->gp_offset = ocount + 1;
              *ipieces_local = local_6c;
              return 0;
            }
            piVar6 = opieces_local + (long)local_68 * 4;
            if (((uint)usedinput[(long)(local_68 / 8) + -8] & 1 << ((byte)local_68 & 7)) == 0)
            break;
            switch(*piVar6) {
            case 0:
              uVar1 = *(uint *)fmt;
              if (uVar1 < 0x29) {
                local_108 = (undefined8 *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                *(uint *)fmt = uVar1 + 8;
              }
              else {
                local_108 = *(undefined8 **)(fmt + 8);
                *(undefined8 **)(fmt + 8) = local_108 + 1;
              }
              *(undefined8 *)(piVar6 + 2) = *local_108;
              break;
            case 1:
            case 2:
              uVar1 = *(uint *)fmt;
              if (uVar1 < 0x29) {
                local_120 = (undefined8 *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                *(uint *)fmt = uVar1 + 8;
              }
              else {
                local_120 = *(undefined8 **)(fmt + 8);
                *(undefined8 **)(fmt + 8) = local_120 + 1;
              }
              *(undefined8 *)(piVar6 + 2) = *local_120;
              break;
            case 3:
            case 0xb:
            case 0xc:
              uVar1 = *(uint *)fmt;
              if (uVar1 < 0x29) {
                local_1b0 = (int *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                *(uint *)fmt = uVar1 + 8;
              }
              else {
                local_1b0 = *(int **)(fmt + 8);
                *(int **)(fmt + 8) = local_1b0 + 2;
              }
              *(long *)(piVar6 + 2) = (long)*local_1b0;
              break;
            case 4:
              uVar1 = *(uint *)fmt;
              if (uVar1 < 0x29) {
                local_180 = (undefined8 *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                *(uint *)fmt = uVar1 + 8;
              }
              else {
                local_180 = *(undefined8 **)(fmt + 8);
                *(undefined8 **)(fmt + 8) = local_180 + 1;
              }
              *(undefined8 *)(piVar6 + 2) = *local_180;
              break;
            case 5:
              uVar1 = *(uint *)fmt;
              if (uVar1 < 0x29) {
                local_150 = (undefined8 *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                *(uint *)fmt = uVar1 + 8;
              }
              else {
                local_150 = *(undefined8 **)(fmt + 8);
                *(undefined8 **)(fmt + 8) = local_150 + 1;
              }
              *(undefined8 *)(piVar6 + 2) = *local_150;
              break;
            case 6:
              uVar1 = *(uint *)fmt;
              if (uVar1 < 0x29) {
                local_198 = (uint *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                *(uint *)fmt = uVar1 + 8;
              }
              else {
                local_198 = *(uint **)(fmt + 8);
                *(uint **)(fmt + 8) = local_198 + 2;
              }
              *(ulong *)(piVar6 + 2) = (ulong)*local_198;
              break;
            case 7:
              uVar1 = *(uint *)fmt;
              if (uVar1 < 0x29) {
                local_168 = (undefined8 *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                *(uint *)fmt = uVar1 + 8;
              }
              else {
                local_168 = *(undefined8 **)(fmt + 8);
                *(undefined8 **)(fmt + 8) = local_168 + 1;
              }
              *(undefined8 *)(piVar6 + 2) = *local_168;
              break;
            case 8:
              uVar1 = *(uint *)fmt;
              if (uVar1 < 0x29) {
                local_138 = (undefined8 *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                *(uint *)fmt = uVar1 + 8;
              }
              else {
                local_138 = *(undefined8 **)(fmt + 8);
                *(undefined8 **)(fmt + 8) = local_138 + 1;
              }
              *(undefined8 *)(piVar6 + 2) = *local_138;
              break;
            case 9:
              uVar1 = *(uint *)(fmt + 4);
              if (uVar1 < 0xa1) {
                local_1d0 = (undefined8 *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                *(uint *)(fmt + 4) = uVar1 + 0x10;
              }
              else {
                local_1d0 = *(undefined8 **)(fmt + 8);
                *(undefined8 **)(fmt + 8) = local_1d0 + 1;
              }
              *(undefined8 *)(piVar6 + 2) = *local_1d0;
              break;
            default:
            }
            local_68 = local_68 + 1;
          }
          return 8;
        }
        if ((char)_param->type == 0x25) break;
        _param = (va_input *)((long)&_param->type + 1);
      }
      bVar3 = true;
      input = (va_input *)((long)&_param->type + 1);
      _param = input;
      pcVar4 = (char *)((long)input + (-1 - (long)iptr));
      if ((char)input->type != 0x25) break;
      if (pcVar4 != (char *)0x0) {
        if (0x80 < local_6c + 1) {
          return 0xb;
        }
        *(undefined4 *)((long)&in_local[(long)local_6c * 2].val + 4) = 0;
        *(undefined4 *)&in_local[(long)local_6c * 2].val = 0x100000;
        *(va_input **)(in_local + (long)local_6c * 2 + 1) = iptr;
        in_local[(long)local_6c * 2 + 1].val.str = pcVar4;
        local_6c = local_6c + 1;
      }
      _param = (va_input *)((long)&pvVar5->type + 2);
      iptr = input;
    }
    type = FORMAT_STRING;
    flags = 0;
    max_param = 0;
    if (start._4_4_ == 1) {
      precision = -1;
    }
    else {
      precision = dollarstring((char *)input,(char **)&param);
      if (precision < 0) {
        if (start._4_4_ == 2) {
          return 1;
        }
        precision = -1;
        start._4_4_ = 1;
      }
      else {
        start._4_4_ = 2;
      }
    }
    while (pvVar5 = _param, bVar3) {
      _param = (va_input *)((long)&_param->type + 1);
      switch((char)pvVar5->type) {
      case ' ':
        max_param = max_param | 1;
        break;
      default:
        bVar3 = false;
        _param = pvVar5;
        break;
      case '#':
        max_param = max_param | 8;
        break;
      case '*':
        max_param = max_param | 0x4000;
        if (start._4_4_ == 2) {
          flags = dollarstring((char *)_param,(char **)&param);
          if ((int)flags < 0) {
            return 2;
          }
        }
        else {
          flags = 0xffffffff;
        }
        break;
      case '+':
        max_param = max_param | 2;
        break;
      case '-':
        max_param = max_param & 0xfffffeffU | 4;
        break;
      case '.':
        if ((char)_param->type == 0x2a) {
          max_param = max_param | 0x10000;
          _param = (va_input *)((long)&pvVar5->type + 2);
          if (start._4_4_ == 2) {
            type = dollarstring((char *)_param,(char **)&param);
            if ((int)type < 0) {
              return 3;
            }
          }
          else {
            type = ~FORMAT_STRING;
          }
        }
        else {
          max_param = max_param | 0x8000;
          type = FORMAT_STRING;
          bVar7 = (char)_param->type == 0x2d;
          if (bVar7) {
            _param = (va_input *)((long)&pvVar5->type + 2);
          }
          while( true ) {
            bVar2 = false;
            if ('/' < (char)_param->type) {
              bVar2 = (char)_param->type < ':';
            }
            if (!bVar2) break;
            if (0xccccccc < (int)type) {
              return 5;
            }
            type = (char)_param->type + -0x30 + type * 10;
            _param = (va_input *)((long)&_param->type + 1);
          }
          if (bVar7) {
            type = -type;
          }
        }
        if ((max_param & 0x18000U) == 0x18000) {
          return 6;
        }
        break;
      case '0':
        if ((max_param & 4U) == 0) {
          max_param = max_param | 0x100;
        }
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        max_param = max_param | 0x2000;
        flags = 0;
        _param = pvVar5;
        do {
          if (0xccccccc < (int)flags) {
            return 7;
          }
          flags = (char)_param->type + -0x30 + flags * 10;
          _param = (va_input *)((long)&_param->type + 1);
          bVar7 = false;
          if ('/' < (char)_param->type) {
            bVar7 = (char)_param->type < ':';
          }
        } while (bVar7);
        break;
      case 'L':
        max_param = max_param | 0x80;
        break;
      case 'O':
        max_param = max_param | 0x20;
        break;
      case 'h':
        max_param = max_param | 0x10;
        break;
      case 'l':
        if ((max_param & 0x20U) == 0) {
          max_param = max_param | 0x20;
        }
        else {
          max_param = max_param | 0x40;
        }
        break;
      case 'q':
        max_param = max_param | 0x40;
        break;
      case 'z':
        max_param = max_param | 0x20;
      }
    }
    switch((char)_param->type) {
    case 'E':
      i = 9;
      max_param = max_param | 0x41000;
      break;
    default:
      goto switchD_00114ea7_caseD_46;
    case 'G':
      i = 9;
      max_param = max_param | 0x81000;
      break;
    case 'S':
      max_param = max_param | 8;
    case 's':
      i = 0;
      break;
    case 'X':
      i = 6;
      max_param = max_param | 0x1a00;
      break;
    case 'c':
      i = 3;
      max_param = max_param | 0x20000;
      break;
    case 'd':
    case 'i':
      if ((max_param & 0x40U) == 0) {
        if ((max_param & 0x20U) == 0) {
          i = 3;
        }
        else {
          i = 4;
        }
      }
      else {
        i = 5;
      }
      break;
    case 'e':
      i = 9;
      max_param = max_param | 0x40000;
      break;
    case 'f':
      i = 9;
      break;
    case 'g':
      i = 9;
      max_param = max_param | 0x80000;
      break;
    case 'n':
      i = 2;
      break;
    case 'o':
      i = 3;
      max_param = max_param | 0x400;
      break;
    case 'p':
      i = 1;
      break;
    case 'u':
      if ((max_param & 0x40U) == 0) {
        if ((max_param & 0x20U) == 0) {
          i = 6;
        }
        else {
          i = 7;
        }
      }
      else {
        i = 8;
      }
      max_param = max_param | 0x200;
      break;
    case 'x':
      i = 6;
      max_param = max_param | 0xa00;
    }
    if ((max_param & 0x4000U) != 0) {
      if ((int)flags < 0) {
        flags = width;
        width = width + 1;
      }
      else if (((uint)usedinput[(long)((int)flags / 8) + -8] & 1 << ((byte)flags & 7)) != 0) {
        return 9;
      }
      if (0x7f < (int)flags) {
        return 4;
      }
      if (ocount <= (int)flags) {
        ocount = flags;
      }
      opieces_local[(long)(int)flags * 4] = 0xb;
      usedinput[(long)((int)flags / 8) + -8] =
           usedinput[(long)((int)flags / 8) + -8] | (byte)(1 << ((byte)flags & 7));
    }
    if ((max_param & 0x10000U) != 0) {
      if ((int)type < 0) {
        type = width;
        width = width + 1;
      }
      else if (((uint)usedinput[(long)((int)type / 8) + -8] & 1 << ((byte)type & 7)) != 0) {
        return 10;
      }
      if (0x7f < (int)type) {
        return 4;
      }
      if (ocount <= (int)type) {
        ocount = type;
      }
      opieces_local[(long)(int)type * 4] = 0xc;
      usedinput[(long)((int)type / 8) + -8] =
           usedinput[(long)((int)type / 8) + -8] | (byte)(1 << ((byte)type & 7));
    }
    if (precision < 0) {
      precision = width;
      width = width + 1;
    }
    if (0x7f < precision) {
      return 4;
    }
    if (ocount <= precision) {
      ocount = precision;
    }
    opieces_local[(long)precision * 4] = i;
    usedinput[(long)(precision / 8) + -8] =
         usedinput[(long)(precision / 8) + -8] | (byte)(1 << ((byte)precision & 7));
    _param = (va_input *)((long)&_param->type + 1);
    pvVar5 = in_local + (long)local_6c * 2;
    if (0x80 < local_6c + 1) {
      return 0xb;
    }
    *(int *)((long)&pvVar5->val + 4) = precision;
    *(int *)&pvVar5->val = max_param;
    pvVar5->type = flags;
    *(FormatType *)&pvVar5->field_0x4 = type;
    *(va_input **)(pvVar5 + 1) = iptr;
    pvVar5[1].val.str = pcVar4;
    iptr = _param;
    local_6c = local_6c + 1;
  } while( true );
switchD_00114ea7_caseD_46:
  goto LAB_001149e0;
}

Assistant:

static int parsefmt(const char *format,
                    struct outsegment *out,
                    struct va_input *in,
                    int *opieces,
                    int *ipieces, va_list arglist)
{
  char *fmt = (char *)format;
  int param_num = 0;
  int param;
  int width;
  int precision;
  unsigned int flags;
  FormatType type;
  int max_param = -1;
  int i;
  int ocount = 0;
  unsigned char usedinput[MAX_PARAMETERS/8];
  size_t outlen = 0;
  struct outsegment *optr;
  int use_dollar = DOLLAR_UNKNOWN;
  char *start = fmt;

  /* clear, set a bit for each used input */
  memset(usedinput, 0, sizeof(usedinput));

  while(*fmt) {
    if(*fmt == '%') {
      struct va_input *iptr;
      bool loopit = TRUE;
      fmt++;
      outlen = fmt - start - 1;
      if(*fmt == '%') {
        /* this means a %% that should be output only as %. Create an output
           segment. */
        if(outlen) {
          optr = &out[ocount++];
          if(ocount > MAX_SEGMENTS)
            return PFMT_MANYSEGS;
          optr->input = 0;
          optr->flags = FLAGS_SUBSTR;
          optr->start = start;
          optr->outlen = outlen;
        }
        start = fmt;
        fmt++;
        continue; /* while */
      }

      flags = width = precision = 0;

      if(use_dollar != DOLLAR_NOPE) {
        param = dollarstring(fmt, &fmt);
        if(param < 0) {
          if(use_dollar == DOLLAR_USE)
            /* illegal combo */
            return PFMT_DOLLAR;

          /* we got no positional, just get the next arg */
          param = -1;
          use_dollar = DOLLAR_NOPE;
        }
        else
          use_dollar = DOLLAR_USE;
      }
      else
        param = -1;

      /* Handle the flags */
      while(loopit) {
        switch(*fmt++) {
        case ' ':
          flags |= FLAGS_SPACE;
          break;
        case '+':
          flags |= FLAGS_SHOWSIGN;
          break;
        case '-':
          flags |= FLAGS_LEFT;
          flags &= ~FLAGS_PAD_NIL;
          break;
        case '#':
          flags |= FLAGS_ALT;
          break;
        case '.':
          if('*' == *fmt) {
            /* The precision is picked from a specified parameter */
            flags |= FLAGS_PRECPARAM;
            fmt++;

            if(use_dollar == DOLLAR_USE) {
              precision = dollarstring(fmt, &fmt);
              if(precision < 0)
                /* illegal combo */
                return PFMT_DOLLARPREC;
            }
            else
              /* get it from the next argument */
              precision = -1;
          }
          else {
            bool is_neg = FALSE;
            flags |= FLAGS_PREC;
            precision = 0;
            if('-' == *fmt) {
              is_neg = TRUE;
              fmt++;
            }
            while(ISDIGIT(*fmt)) {
              if(precision > INT_MAX/10)
                return PFMT_PREC;
              precision *= 10;
              precision += *fmt - '0';
              fmt++;
            }
            if(is_neg)
              precision = -precision;
          }
          if((flags & (FLAGS_PREC | FLAGS_PRECPARAM)) ==
             (FLAGS_PREC | FLAGS_PRECPARAM))
            /* it is not permitted to use both kinds of precision for the same
               argument */
            return PFMT_PRECMIX;
          break;
        case 'h':
          flags |= FLAGS_SHORT;
          break;
#if defined(MP_HAVE_INT_EXTENSIONS)
        case 'I':
          if((fmt[0] == '3') && (fmt[1] == '2')) {
            flags |= FLAGS_LONG;
            fmt += 2;
          }
          else if((fmt[0] == '6') && (fmt[1] == '4')) {
            flags |= FLAGS_LONGLONG;
            fmt += 2;
          }
          else {
#if (SIZEOF_CURL_OFF_T > SIZEOF_LONG)
            flags |= FLAGS_LONGLONG;
#else
            flags |= FLAGS_LONG;
#endif
          }
          break;
#endif
        case 'l':
          if(flags & FLAGS_LONG)
            flags |= FLAGS_LONGLONG;
          else
            flags |= FLAGS_LONG;
          break;
        case 'L':
          flags |= FLAGS_LONGDOUBLE;
          break;
        case 'q':
          flags |= FLAGS_LONGLONG;
          break;
        case 'z':
          /* the code below generates a warning if -Wunreachable-code is
             used */
#if (SIZEOF_SIZE_T > SIZEOF_LONG)
          flags |= FLAGS_LONGLONG;
#else
          flags |= FLAGS_LONG;
#endif
          break;
        case 'O':
#if (SIZEOF_CURL_OFF_T > SIZEOF_LONG)
          flags |= FLAGS_LONGLONG;
#else
          flags |= FLAGS_LONG;
#endif
          break;
        case '0':
          if(!(flags & FLAGS_LEFT))
            flags |= FLAGS_PAD_NIL;
          FALLTHROUGH();
        case '1': case '2': case '3': case '4':
        case '5': case '6': case '7': case '8': case '9':
          flags |= FLAGS_WIDTH;
          width = 0;
          fmt--;
          do {
            if(width > INT_MAX/10)
              return PFMT_WIDTH;
            width *= 10;
            width += *fmt - '0';
            fmt++;
          } while(ISDIGIT(*fmt));
          break;
        case '*':  /* read width from argument list */
          flags |= FLAGS_WIDTHPARAM;
          if(use_dollar == DOLLAR_USE) {
            width = dollarstring(fmt, &fmt);
            if(width < 0)
              /* illegal combo */
              return PFMT_DOLLARWIDTH;
          }
          else
            /* pick from the next argument */
            width = -1;
          break;
        default:
          loopit = FALSE;
          fmt--;
          break;
        } /* switch */
      } /* while */

      switch(*fmt) {
      case 'S':
        flags |= FLAGS_ALT;
        FALLTHROUGH();
      case 's':
        type = FORMAT_STRING;
        break;
      case 'n':
        type = FORMAT_INTPTR;
        break;
      case 'p':
        type = FORMAT_PTR;
        break;
      case 'd':
      case 'i':
        if(flags & FLAGS_LONGLONG)
          type = FORMAT_LONGLONG;
        else if(flags & FLAGS_LONG)
          type = FORMAT_LONG;
        else
          type = FORMAT_INT;
        break;
      case 'u':
        if(flags & FLAGS_LONGLONG)
          type = FORMAT_LONGLONGU;
        else if(flags & FLAGS_LONG)
          type = FORMAT_LONGU;
        else
          type = FORMAT_INTU;
        flags |= FLAGS_UNSIGNED;
        break;
      case 'o':
        type = FORMAT_INT;
        flags |= FLAGS_OCTAL;
        break;
      case 'x':
        type = FORMAT_INTU;
        flags |= FLAGS_HEX|FLAGS_UNSIGNED;
        break;
      case 'X':
        type = FORMAT_INTU;
        flags |= FLAGS_HEX|FLAGS_UPPER|FLAGS_UNSIGNED;
        break;
      case 'c':
        type = FORMAT_INT;
        flags |= FLAGS_CHAR;
        break;
      case 'f':
        type = FORMAT_DOUBLE;
        break;
      case 'e':
        type = FORMAT_DOUBLE;
        flags |= FLAGS_FLOATE;
        break;
      case 'E':
        type = FORMAT_DOUBLE;
        flags |= FLAGS_FLOATE|FLAGS_UPPER;
        break;
      case 'g':
        type = FORMAT_DOUBLE;
        flags |= FLAGS_FLOATG;
        break;
      case 'G':
        type = FORMAT_DOUBLE;
        flags |= FLAGS_FLOATG|FLAGS_UPPER;
        break;
      default:
        /* invalid instruction, disregard and continue */
        continue;
      } /* switch */

      if(flags & FLAGS_WIDTHPARAM) {
        if(width < 0)
          width = param_num++;
        else {
          /* if this identifies a parameter already used, this
             is illegal */
          if(usedinput[width/8] & (1 << (width&7)))
            return PFMT_WIDTHARG;
        }
        if(width >= MAX_PARAMETERS)
          return PFMT_MANYARGS;
        if(width >= max_param)
          max_param = width;

        in[width].type = FORMAT_WIDTH;
        /* mark as used */
        usedinput[width/8] |= (unsigned char)(1 << (width&7));
      }

      if(flags & FLAGS_PRECPARAM) {
        if(precision < 0)
          precision = param_num++;
        else {
          /* if this identifies a parameter already used, this
             is illegal */
          if(usedinput[precision/8] & (1 << (precision&7)))
            return PFMT_PRECARG;
        }
        if(precision >= MAX_PARAMETERS)
          return PFMT_MANYARGS;
        if(precision >= max_param)
          max_param = precision;

        in[precision].type = FORMAT_PRECISION;
        usedinput[precision/8] |= (unsigned char)(1 << (precision&7));
      }

      /* Handle the specifier */
      if(param < 0)
        param = param_num++;
      if(param >= MAX_PARAMETERS)
        return PFMT_MANYARGS;
      if(param >= max_param)
        max_param = param;

      iptr = &in[param];
      iptr->type = type;

      /* mark this input as used */
      usedinput[param/8] |= (unsigned char)(1 << (param&7));

      fmt++;
      optr = &out[ocount++];
      if(ocount > MAX_SEGMENTS)
        return PFMT_MANYSEGS;
      optr->input = param;
      optr->flags = flags;
      optr->width = width;
      optr->precision = precision;
      optr->start = start;
      optr->outlen = outlen;
      start = fmt;
    }
    else
      fmt++;
  }

  /* is there a trailing piece */
  outlen = fmt - start;
  if(outlen) {
    optr = &out[ocount++];
    if(ocount > MAX_SEGMENTS)
      return PFMT_MANYSEGS;
    optr->input = 0;
    optr->flags = FLAGS_SUBSTR;
    optr->start = start;
    optr->outlen = outlen;
  }

  /* Read the arg list parameters into our data list */
  for(i = 0; i < max_param + 1; i++) {
    struct va_input *iptr = &in[i];
    if(!(usedinput[i/8] & (1 << (i&7))))
      /* bad input */
      return PFMT_INPUTGAP;

    /* based on the type, read the correct argument */
    switch(iptr->type) {
    case FORMAT_STRING:
      iptr->val.str = va_arg(arglist, char *);
      break;

    case FORMAT_INTPTR:
    case FORMAT_PTR:
      iptr->val.ptr = va_arg(arglist, void *);
      break;

    case FORMAT_LONGLONGU:
      iptr->val.numu = (mp_uintmax_t)va_arg(arglist, mp_uintmax_t);
      break;

    case FORMAT_LONGLONG:
      iptr->val.nums = (mp_intmax_t)va_arg(arglist, mp_intmax_t);
      break;

    case FORMAT_LONGU:
      iptr->val.numu = (mp_uintmax_t)va_arg(arglist, unsigned long);
      break;

    case FORMAT_LONG:
      iptr->val.nums = (mp_intmax_t)va_arg(arglist, long);
      break;

    case FORMAT_INTU:
      iptr->val.numu = (mp_uintmax_t)va_arg(arglist, unsigned int);
      break;

    case FORMAT_INT:
    case FORMAT_WIDTH:
    case FORMAT_PRECISION:
      iptr->val.nums = (mp_intmax_t)va_arg(arglist, int);
      break;

    case FORMAT_DOUBLE:
      iptr->val.dnum = va_arg(arglist, double);
      break;

    default:
      DEBUGASSERT(NULL); /* unexpected */
      break;
    }
  }
  *ipieces = max_param + 1;
  *opieces = ocount;

  return PFMT_OK;
}